

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

bool __thiscall filesystem::path::is_directory(path *this)

{
  int iVar1;
  string local_c8;
  stat sb;
  
  str_abi_cxx11_(&local_c8,this,native_path);
  iVar1 = stat(local_c8._M_dataplus._M_p,(stat *)&sb);
  std::__cxx11::string::~string((string *)&local_c8);
  return (sb.st_mode & 0xf000) == 0x4000 && iVar1 == 0;
}

Assistant:

bool is_directory() const {
#if defined(_WIN32)
        DWORD result = GetFileAttributesW(wstr().c_str());
        if (result == INVALID_FILE_ATTRIBUTES)
            return false;
        return (result & FILE_ATTRIBUTE_DIRECTORY) != 0;
#else
        struct stat sb;
        if (stat(str().c_str(), &sb))
            return false;
        return S_ISDIR(sb.st_mode);
#endif
    }